

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_glossary_ds(arg_dstr_t ds,void **argtable,char *format)

{
  undefined8 uVar1;
  void **ppvVar2;
  byte *pbVar3;
  char *fmt;
  char syntax [200];
  char *in_stack_ffffffffffffff08;
  
  fmt = "  %-20s %s\n";
  if (format != (char *)0x0) {
    fmt = format;
  }
  pbVar3 = (byte *)*argtable;
  if ((*pbVar3 & 1) == 0) {
    ppvVar2 = argtable + 1;
    do {
      if (*(long *)(pbVar3 + 0x20) != 0) {
        memset(&stack0xffffffffffffff08,0,200);
        uVar1 = *(undefined8 *)(pbVar3 + 0x20);
        arg_cat_optionv(&stack0xffffffffffffff08,*(size_t *)(pbVar3 + 8),*(char **)(pbVar3 + 0x10),
                        *(char **)(pbVar3 + 0x18),(char *)(ulong)(*pbVar3 & 4),0x10d716,
                        in_stack_ffffffffffffff08);
        arg_dstr_catf(ds,fmt,&stack0xffffffffffffff08,uVar1);
      }
      pbVar3 = (byte *)*ppvVar2;
      ppvVar2 = ppvVar2 + 1;
    } while ((*pbVar3 & 1) == 0);
  }
  return;
}

Assistant:

void arg_print_glossary_ds(arg_dstr_t ds, void** argtable, const char* format) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;

    format = format ? format : "  %-20s %s\n";
    for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        if (table[tabindex]->glossary) {
            char syntax[200] = "";
            const char* shortopts = table[tabindex]->shortopts;
            const char* longopts = table[tabindex]->longopts;
            const char* datatype = table[tabindex]->datatype;
            const char* glossary = table[tabindex]->glossary;
            arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, ", ");
            arg_dstr_catf(ds, format, syntax, glossary);
        }
    }
}